

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int put_bit(bitstream *str,h264_cabac_context *cabac,uint32_t bit)

{
  int iVar1;
  uint32_t nbit;
  uint32_t bit_local;
  
  _nbit = CONCAT44(bit,(uint)(bit == 0));
  if (cabac->firstBitFlag == 0) {
    iVar1 = vs_u(str,&bit_local,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    cabac->firstBitFlag = 0;
    if (bit != 0) {
      fwrite("CABAC initial skipped bit not 0\n",0x20,1,_stderr);
      return 1;
    }
  }
  do {
    if (cabac->bitsOutstanding == 0) {
      return 0;
    }
    cabac->bitsOutstanding = cabac->bitsOutstanding + -1;
    iVar1 = vs_u(str,&nbit,1);
  } while (iVar1 == 0);
  return 1;
}

Assistant:

static int put_bit(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t bit) {
	uint32_t nbit = !bit;
	if (cabac->firstBitFlag) {
		cabac->firstBitFlag = 0;
		if (bit != 0) {
			fprintf (stderr, "CABAC initial skipped bit not 0\n");
			return 1;
		}
	} else {
		if (vs_u(str, &bit, 1))
			return 1;
	}
	while (cabac->bitsOutstanding) {
		cabac->bitsOutstanding--;
		if (vs_u(str, &nbit, 1))
			return 1;
	}
	return 0;
}